

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.h
# Opt level: O3

bool __thiscall QRelation::isValid(QRelation *this)

{
  bool bVar1;
  
  if (((this->rel).tName.d.size == 0) || ((this->rel).iColumn.d.size == 0)) {
    bVar1 = false;
  }
  else {
    bVar1 = (this->rel).dColumn.d.size != 0;
  }
  return (bool)(this->m_parent != (QSqlRelationalTableModel *)0x0 & bVar1);
}

Assistant:

constexpr bool isEmpty() const noexcept { return size() == 0; }